

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool exrCheck(char *filename,bool reduceMemory,bool reduceTime,bool useStream,bool enableCoreCheck)

{
  undefined1 uVar1;
  ostream *poVar2;
  ulong __n;
  undefined7 in_register_00000009;
  allocator_type local_249;
  vector<char,_std::allocator<char>_> data;
  ifstream instream;
  ulong local_228;
  byte abStack_210 [488];
  
  if ((int)CONCAT71(in_register_00000009,useStream) != 0) {
    std::ifstream::ifstream(&instream,filename,_S_bin);
    if ((abStack_210[*(long *)(_instream + -0x18)] & 5) == 0) {
      std::istream::seekg((long)&instream,_S_beg);
      __n = std::istream::tellg();
      std::istream::seekg((long)&instream,_S_beg);
      if (__n >> 0x3e == 0) {
        std::vector<char,_std::allocator<char>_>::vector(&data,__n,&local_249);
        std::istream::read((char *)&instream,
                           (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start);
        if (local_228 == __n) {
          uVar1 = Imf_3_4::checkOpenEXRFile
                            (data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start,__n,reduceMemory,reduceTime,
                             enableCoreCheck);
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cerr,"internal error: failed to read file ");
          poVar2 = std::operator<<(poVar2,filename);
          uVar1 = 1;
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&data.super__Vector_base<char,_std::allocator<char>_>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,"internal error: bad file length ");
        poVar2 = std::ostream::_M_insert<long>((long)poVar2);
        poVar2 = std::operator<<(poVar2," for in-memory stream");
        uVar1 = 1;
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"internal error: bad file \'");
      poVar2 = std::operator<<(poVar2,filename);
      poVar2 = std::operator<<(poVar2,"\' for in-memory stream");
      uVar1 = 1;
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::ifstream::~ifstream(&instream);
    return (bool)uVar1;
  }
  uVar1 = Imf_3_4::checkOpenEXRFile(filename,reduceMemory,reduceTime,enableCoreCheck);
  return (bool)uVar1;
}

Assistant:

bool
exrCheck (
    const char* filename,
    bool        reduceMemory,
    bool        reduceTime,
    bool        useStream,
    bool        enableCoreCheck)
{
    if (useStream)
    {
        //
        // open file as stream, check size
        //
        ifstream instream (filename, ifstream::binary);

        if (!instream)
        {
            cerr << "internal error: bad file '" << filename
                 << "' for in-memory stream" << endl;
            return true;
        }

        instream.seekg (0, instream.end);
        streampos length = instream.tellg ();
        instream.seekg (0, instream.beg);

        const uintptr_t kMaxSize = uintptr_t (-1) / 4;
        if (length < 0 || length > (streampos) kMaxSize)
        {
            cerr << "internal error: bad file length " << length
                 << " for in-memory stream" << endl;
            return true;
        }

        //
        // read into memory
        //
        vector<char> data (length);
        instream.read (data.data (), length);
        if (instream.gcount () != length)
        {
            cerr << "internal error: failed to read file " << filename << endl;
            return true;
        }
        return checkOpenEXRFile (
            data.data (), length, reduceMemory, reduceTime, enableCoreCheck);
    }
    else
    {
        return checkOpenEXRFile (
            filename, reduceMemory, reduceTime, enableCoreCheck);
    }
}